

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

void __thiscall
fmt::v11::detail::buffer<char>::append<char>(buffer<char> *this,char *begin,char *end)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  ulong local_40;
  size_t i;
  char *out;
  size_t free_cap;
  make_unsigned_t<long> count;
  char *end_local;
  char *begin_local;
  buffer<char> *this_local;
  
  for (end_local = begin; end_local != end; end_local = end_local + free_cap) {
    free_cap = to_unsigned<long>((long)end - (long)end_local);
    try_reserve(this,this->size_ + free_cap);
    uVar3 = this->capacity_ - this->size_;
    if (uVar3 < free_cap) {
      free_cap = uVar3;
    }
    pcVar1 = this->ptr_;
    sVar2 = this->size_;
    for (local_40 = 0; local_40 < free_cap; local_40 = local_40 + 1) {
      pcVar1[local_40 + sVar2] = end_local[local_40];
    }
    this->size_ = free_cap + this->size_;
  }
  return;
}

Assistant:

void
      append(const U* begin, const U* end) {
    while (begin != end) {
      auto count = to_unsigned(end - begin);
      try_reserve(size_ + count);
      auto free_cap = capacity_ - size_;
      if (free_cap < count) count = free_cap;
      // A loop is faster than memcpy on small sizes.
      T* out = ptr_ + size_;
      for (size_t i = 0; i < count; ++i) out[i] = begin[i];
      size_ += count;
      begin += count;
    }
  }